

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VAOCache.cpp
# Opt level: O3

void __thiscall Diligent::VAOCache::VAOHashKey::VAOHashKey(VAOHashKey *this,VAOAttribs *Attribs)

{
  VertexStreamInfo<Diligent::BufferGLImpl> *pVVar1;
  uint uVar2;
  LayoutElement *pLVar3;
  Int32 IVar4;
  int iVar5;
  long lVar6;
  GraphicsPipelineDesc *pGVar7;
  char (*in_RCX) [37];
  BufferGLImpl *this_00;
  char (*in_R8) [36];
  Uint32 *pUVar8;
  StreamAttribs *DstStream;
  StreamAttribs *FirstArg;
  Uint32 *Args_4;
  ulong uVar9;
  char (*in_stack_ffffffffffffff68) [8];
  undefined1 local_89;
  size_t Seed;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_78;
  Uint32 BufferSlot;
  int local_64;
  size_t *local_60;
  Uint32 *local_58;
  GraphicsPipelineDesc *local_50;
  StreamAttribs *local_48;
  char *local_40;
  char *local_38;
  
  IVar4 = DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
          ::GetUniqueID((DeviceObjectBase<Diligent::IPipelineStateGL,_Diligent::RenderDeviceGLImpl,_Diligent::PipelineStateDesc>
                         *)Attribs->PSO);
  this->PsoUId = IVar4;
  if (Attribs->pIndexBuffer == (BufferGLImpl *)0x0) {
    IVar4 = 0;
  }
  else {
    IVar4 = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
            ::GetUniqueID((DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                           *)Attribs->pIndexBuffer);
  }
  this->IndexBufferUId = IVar4;
  this->UsedSlotsMask = 0;
  local_60 = &this->Hash;
  this->Hash = 0;
  local_48 = this->Streams;
  lVar6 = 0x10;
  do {
    *(undefined4 *)((long)&((VAOHashKey *)(this->Streams + -1))->PsoUId + lVar6) = 0xffffffff;
    lVar6 = lVar6 + 0x10;
  } while (lVar6 != 0x210);
  pGVar7 = PipelineStateBase<Diligent::EngineGLImplTraits>::GetGraphicsPipelineDesc
                     (&Attribs->PSO->super_PipelineStateBase<Diligent::EngineGLImplTraits>);
  pLVar3 = (pGVar7->InputLayout).LayoutElements;
  Seed = 0;
  HashCombine<int,int>(&Seed,&this->PsoUId,&this->IndexBufferUId);
  this->Hash = Seed;
  if ((pGVar7->InputLayout).NumElements != 0) {
    Args_4 = &Attribs->NumVertexStreams;
    pUVar8 = &pLVar3->BufferSlot;
    uVar9 = 0;
    local_58 = Args_4;
    local_50 = pGVar7;
    do {
      BufferSlot = *pUVar8;
      if (0x1f < BufferSlot) {
        FormatString<char[26],char[30]>
                  ((string *)&Seed,(Diligent *)"Debug expression failed:\n",
                   (char (*) [26])"BufferSlot < MAX_BUFFER_SLOTS",(char (*) [30])in_RCX);
        DebugAssertionFailed
                  ((Char *)Seed,"VAOHashKey",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                   ,0xbd);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)Seed != &local_78) {
          operator_delete((void *)Seed,local_78._M_allocated_capacity + 1);
        }
      }
      if (*Args_4 <= BufferSlot) {
        local_64 = BufferSlot + 1;
        local_38 = "s";
        if (BufferSlot == 0) {
          local_38 = "";
        }
        local_89 = 0x20;
        local_40 = "are";
        if (*Args_4 == 1) {
          local_40 = "is";
        }
        in_R8 = (char (*) [36])&local_38;
        FormatString<char[32],unsigned_int,char[8],char_const*,char[12],unsigned_int,char,char_const*,char[8]>
                  ((string *)&Seed,(Diligent *)"Input layout requires at least ",
                   (char (*) [32])&local_64,(uint *)0x8305b4,(char (*) [8])in_R8,(char **)0x906fa5,
                   (char (*) [12])Args_4,(uint *)&local_89,(char *)&local_40,(char **)0x818893,
                   in_stack_ffffffffffffff68);
        DebugAssertionFailed
                  ((Char *)Seed,"VAOHashKey",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                   ,0xc0);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)Seed != &local_78) {
          operator_delete((void *)Seed,local_78._M_allocated_capacity + 1);
        }
      }
      pVVar1 = Attribs->VertexStreams + BufferSlot;
      this_00 = Attribs->VertexStreams[BufferSlot].pBuffer.m_pObject;
      if (this_00 == (BufferGLImpl *)0x0) {
        FormatString<char[29],unsigned_int,char[36]>
                  ((string *)&Seed,(Diligent *)"VAO requires buffer at slot ",
                   (char (*) [29])&BufferSlot,(uint *)", but none is bound in the context.",in_R8);
        DebugAssertionFailed
                  ((Char *)Seed,"VAOHashKey",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                   ,0xc3);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)Seed != &local_78) {
          operator_delete((void *)Seed,local_78._M_allocated_capacity + 1);
        }
        this_00 = (pVVar1->pBuffer).m_pObject;
        if (this_00 != (BufferGLImpl *)0x0) goto LAB_0031dfa9;
        iVar5 = 0;
      }
      else {
LAB_0031dfa9:
        iVar5 = DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                ::GetUniqueID((DeviceObjectBase<Diligent::IBufferGL,_Diligent::RenderDeviceGLImpl,_Diligent::BufferDesc>
                               *)this_00);
      }
      in_RCX = (char (*) [37])(ulong)BufferSlot;
      uVar2 = this->UsedSlotsMask;
      FirstArg = local_48 + (long)in_RCX;
      if ((uVar2 >> (BufferSlot & 0x1f) & 1) == 0) {
        FirstArg->BufferUId = iVar5;
        FirstArg->Offset = pVVar1->Offset;
        this->UsedSlotsMask = uVar2 | 1 << ((byte)BufferSlot & 0x1f);
        HashCombine<int,unsigned_long>(local_60,&FirstArg->BufferUId,&FirstArg->Offset);
        Args_4 = local_58;
      }
      else {
        if (FirstArg->BufferUId != iVar5) {
          FormatString<char[26],char[30]>
                    ((string *)&Seed,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"DstStream.BufferUId == BuffId",(char (*) [30])in_RCX);
          in_RCX = (char (*) [37])0xd3;
          DebugAssertionFailed
                    ((Char *)Seed,"VAOHashKey",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                     ,0xd3);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)Seed != &local_78) {
            operator_delete((void *)Seed,local_78._M_allocated_capacity + 1);
          }
        }
        Args_4 = local_58;
        if (FirstArg->Offset != pVVar1->Offset) {
          FormatString<char[26],char[37]>
                    ((string *)&Seed,(Diligent *)"Debug expression failed:\n",
                     (char (*) [26])"DstStream.Offset == SrcStream.Offset",in_RCX);
          in_RCX = (char (*) [37])0xd4;
          DebugAssertionFailed
                    ((Char *)Seed,"VAOHashKey",
                     "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/VAOCache.cpp"
                     ,0xd4);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)Seed != &local_78) {
            operator_delete((void *)Seed,local_78._M_allocated_capacity + 1);
          }
        }
      }
      uVar9 = uVar9 + 1;
      pUVar8 = pUVar8 + 10;
    } while (uVar9 < (local_50->InputLayout).NumElements);
    Seed = *local_60;
  }
  uVar2 = this->UsedSlotsMask * 0x1001;
  uVar2 = (uVar2 >> 0x16 ^ uVar2) * 0x11;
  uVar2 = (uVar2 >> 9 ^ uVar2) * 0x401;
  this->Hash = (Seed >> 2) + Seed * 0x40 + 0x9e3779b9 + (ulong)((uVar2 >> 2 ^ uVar2) * 0x81081) ^
               Seed;
  return;
}

Assistant:

VAOCache::VAOHashKey::VAOHashKey(const VAOAttribs& Attribs) :
    // clang-format off
    PsoUId         {Attribs.PSO.GetUniqueID()},
    IndexBufferUId {Attribs.pIndexBuffer ? Attribs.pIndexBuffer->GetUniqueID() : 0}
// clang-format on
{
#ifdef DILIGENT_DEBUG
    for (Uint32 i = 0; i < _countof(Streams); ++i)
        Streams[i].BufferUId = -1;
#endif

    const auto& InputLayout    = Attribs.PSO.GetGraphicsPipelineDesc().InputLayout;
    const auto* LayoutElements = InputLayout.LayoutElements;

    Hash = ComputeHash(PsoUId, IndexBufferUId);
    for (Uint32 i = 0; i < InputLayout.NumElements; ++i)
    {
        const auto& LayoutElem = LayoutElements[i];
        const auto  BufferSlot = LayoutElem.BufferSlot;
        VERIFY_EXPR(BufferSlot < MAX_BUFFER_SLOTS);
        DEV_CHECK_ERR(BufferSlot < Attribs.NumVertexStreams, "Input layout requires at least ", BufferSlot + 1,
                      " buffer", (BufferSlot > 0 ? "s" : ""), ", but only ", Attribs.NumVertexStreams, ' ',
                      (Attribs.NumVertexStreams == 1 ? "is" : "are"), " bound.");

        const auto& SrcStream = Attribs.VertexStreams[BufferSlot];
        DEV_CHECK_ERR(SrcStream.pBuffer, "VAO requires buffer at slot ", BufferSlot, ", but none is bound in the context.");

        const auto BuffId  = SrcStream.pBuffer ? SrcStream.pBuffer->GetUniqueID() : 0;
        const auto SlotBit = 1u << BufferSlot;
        if ((UsedSlotsMask & SlotBit) == 0)
        {
            auto& DstStream     = Streams[BufferSlot];
            DstStream.BufferUId = BuffId;
            DstStream.Offset    = SrcStream.Offset;
            UsedSlotsMask |= SlotBit;
            HashCombine(Hash, DstStream.BufferUId, DstStream.Offset);
        }
        else
        {
            const auto& DstStream = Streams[BufferSlot];
            // The slot has already been initialized
            VERIFY_EXPR(DstStream.BufferUId == BuffId);
            VERIFY_EXPR(DstStream.Offset == SrcStream.Offset);
        }
    }
    HashCombine(Hash, UsedSlotsMask);
}